

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void set_fill_boolean(lyxp_set *set,int boolean)

{
  if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
    free((set->val).nodes);
  }
  set->type = LYXP_SET_BOOLEAN;
  (set->val).bool = boolean;
  return;
}

Assistant:

static void
set_fill_boolean(struct lyxp_set *set, int boolean)
{
    if (set->type == LYXP_SET_NODE_SET) {
        free(set->val.nodes);
    } else if (set->type == LYXP_SET_STRING) {
        free(set->val.str);
    }

    set->type = LYXP_SET_BOOLEAN;
    set->val.bool = boolean;
}